

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

void sei_free(sei_t *sei)

{
  _sei_message_t *p_Var1;
  sei_t *in_RDI;
  sei_message_t *tail;
  
  while (in_RDI->head != (sei_message_t *)0x0) {
    p_Var1 = in_RDI->head->next;
    free(in_RDI->head);
    in_RDI->head = p_Var1;
  }
  sei_init(in_RDI,0.0);
  return;
}

Assistant:

void sei_free(sei_t* sei)
{
    sei_message_t* tail;

    while (sei->head) {
        tail = sei->head->next;
        free(sei->head);
        sei->head = tail;
    }

    sei_init(sei, 0);
}